

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

pointer __thiscall
google::
dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
::alloc_impl<google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::
realloc_or_die(alloc_impl<google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
               *this,pointer ptr,size_type n)

{
  pointer ppVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  pointer retval;
  pointer in_stack_ffffffffffffffd8;
  libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_> *in_stack_ffffffffffffffe0;
  
  ppVar1 = libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>::reallocate
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x20aec7);
  if (ppVar1 == (pointer)0x0) {
    fprintf(_stderr,"sparsehash: FATAL ERROR: failed to reallocate %lu elements for ptr %p",in_RDX,
            in_RSI);
    exit(1);
  }
  return ppVar1;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }